

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O0

bool __thiscall dxil_spv::MemoryStream::map_string_iterate(MemoryStream *this,char **str)

{
  bool bVar1;
  char local_21;
  char **ppcStack_20;
  char c;
  char **str_local;
  MemoryStream *this_local;
  
  *str = (char *)(this->blob + this->blob_offset);
  ppcStack_20 = str;
  str_local = (char **)this;
  do {
    bVar1 = read<char>(this,&local_21);
    if (!bVar1) {
      return false;
    }
  } while ((local_21 != '\0') && (local_21 != '\0'));
  return true;
}

Assistant:

bool MemoryStream::map_string_iterate(const char *&str)
{
	// Strings are C strings and can be mapped 1:1.
	// Just need to verify they terminate properly.
	str = reinterpret_cast<const char *>(blob + blob_offset);
	char c;

	do
	{
		if (!read(c))
			return false;
		else if (c == '\0')
			break;
	} while (c != '\0');

	return true;
}